

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void getSWTRecCoeff(double *coeff,int *length,char *ctype,int level,int J,double *lpr,double *hpr,
                   int lf,int siglength,double *swtop)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  double *x;
  double *x_00;
  double *y;
  double *oup;
  double *oup_00;
  double *oup_01;
  double *oup_02;
  void *__ptr_03;
  double *array;
  double dVar3;
  double *det2;
  double *appx2;
  double *oup01;
  double *oup00;
  double *oup00H;
  double *oup00L;
  double *tempx;
  double *cH0;
  double *cL0;
  double *det_sig;
  double *appx_sig;
  double *det1;
  double *appx1;
  int index2;
  int N1;
  int U;
  int len0;
  int index_shift;
  int len;
  int count;
  int value;
  int index;
  int i;
  int iter;
  int N;
  double *lpr_local;
  int J_local;
  int level_local;
  char *ctype_local;
  int *length_local;
  double *coeff_local;
  
  __ptr = malloc((long)siglength << 3);
  __ptr_00 = malloc((long)siglength << 3);
  __ptr_01 = malloc((long)siglength << 3);
  __ptr_02 = malloc((long)siglength << 3);
  x = (double *)malloc((long)siglength << 3);
  x_00 = (double *)malloc((long)siglength << 3);
  y = (double *)malloc((long)siglength << 3);
  oup = (double *)malloc((long)(siglength + siglength % 2 + lf) << 3);
  oup_00 = (double *)malloc((long)(siglength + siglength % 2 + lf) << 3);
  oup_01 = (double *)malloc((long)(siglength + lf * 2) << 3);
  oup_02 = (double *)malloc((long)(siglength + lf * 2) << 3);
  __ptr_03 = malloc((long)siglength << 3);
  array = (double *)malloc((long)siglength << 3);
  for (index = J - level; index < J; index = index + 1) {
    for (value = 0; value < siglength; value = value + 1) {
      swtop[value] = 0.0;
    }
    iVar1 = strcmp(ctype,"appx");
    if ((iVar1 == 0) && (index == J - level)) {
      for (value = 0; value < siglength; value = value + 1) {
        *(double *)((long)__ptr + (long)value * 8) = coeff[value];
        *(undefined8 *)((long)__ptr_00 + (long)value * 8) = 0;
      }
    }
    else {
      iVar1 = strcmp(ctype,"det");
      if ((iVar1 == 0) && (index == J - level)) {
        for (value = 0; value < siglength; value = value + 1) {
          *(double *)((long)__ptr_00 + (long)value * 8) = coeff[value];
          *(undefined8 *)((long)__ptr + (long)value * 8) = 0;
        }
      }
      else {
        for (value = 0; value < siglength; value = value + 1) {
          *(undefined8 *)((long)__ptr_00 + (long)value * 8) = 0;
        }
      }
    }
    dVar3 = pow(2.0,(double)((J + -1) - index));
    iVar1 = (int)dVar3;
    for (index_shift = 0; index_shift < iVar1; index_shift = index_shift + 1) {
      len0 = 0;
      for (count = index_shift; count < siglength; count = iVar1 + count) {
        *(undefined8 *)((long)__ptr_01 + (long)len0 * 8) =
             *(undefined8 *)((long)__ptr + (long)count * 8);
        *(undefined8 *)((long)__ptr_02 + (long)len0 * 8) =
             *(undefined8 *)((long)__ptr_00 + (long)count * 8);
        len0 = len0 + 1;
      }
      N1 = 0;
      for (U = 0; U < len0; U = U + 2) {
        x[N1] = *(double *)((long)__ptr_01 + (long)U * 8);
        x_00[N1] = *(double *)((long)__ptr_02 + (long)U * 8);
        N1 = N1 + 1;
      }
      upsamp2(x,N1,2,y);
      per_ext(y,N1 << 1,lf / 2,oup);
      upsamp2(x_00,N1,2,y);
      per_ext(y,N1 << 1,lf / 2,oup_00);
      iVar2 = N1 * 2 + lf;
      conv_direct(oup,iVar2,lpr,lf,oup_01);
      conv_direct(oup_00,iVar2,hpr,lf,oup_02);
      for (value = lf + -1; value < N1 * 2 + lf + -1; value = value + 1) {
        *(double *)((long)__ptr_03 + (long)((value - lf) + 1) * 8) = oup_01[value] + oup_02[value];
      }
      N1 = 0;
      for (U = 1; U < len0; U = U + 2) {
        x[N1] = *(double *)((long)__ptr_01 + (long)U * 8);
        x_00[N1] = *(double *)((long)__ptr_02 + (long)U * 8);
        N1 = N1 + 1;
      }
      upsamp2(x,N1,2,y);
      per_ext(y,N1 << 1,lf / 2,oup);
      upsamp2(x_00,N1,2,y);
      per_ext(y,N1 << 1,lf / 2,oup_00);
      iVar2 = N1 * 2 + lf;
      conv_direct(oup,iVar2,lpr,lf,oup_01);
      conv_direct(oup_00,iVar2,hpr,lf,oup_02);
      for (value = lf + -1; value < N1 * 2 + lf + -1; value = value + 1) {
        array[(value - lf) + 1] = oup_01[value] + oup_02[value];
      }
      circshift(array,N1 << 1,-1);
      appx1._0_4_ = 0;
      for (count = index_shift; count < siglength; count = iVar1 + count) {
        swtop[count] = (*(double *)((long)__ptr_03 + (long)(int)appx1 * 8) + array[(int)appx1]) /
                       2.0;
        appx1._0_4_ = (int)appx1 + 1;
      }
    }
    for (value = 0; value < siglength; value = value + 1) {
      *(double *)((long)__ptr + (long)value * 8) = swtop[value];
    }
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(y);
  free(oup);
  free(oup_00);
  free(oup_01);
  free(oup_02);
  free(__ptr_03);
  free(array);
  free(x);
  free(x_00);
  return;
}

Assistant:

static void getSWTRecCoeff(double *coeff, int *length, const char *ctype, int level, int J, double *lpr,
	double *hpr, int lf, int siglength, double *swtop) {
	int N, iter, i, index, value, count, len;
	int index_shift, len0, U, N1, index2;
	double *appx1, *det1, *appx_sig, *det_sig, *cL0, *cH0, *tempx, *oup00L, *oup00H, *oup00, *oup01, *appx2, *det2;

	N = siglength;
	U = 2;

	appx_sig = (double*)malloc(sizeof(double)* N);
	det_sig = (double*)malloc(sizeof(double)* N);
	appx1 = (double*)malloc(sizeof(double)* N);
	det1 = (double*)malloc(sizeof(double)* N);
	appx2 = (double*)malloc(sizeof(double)* N);
	det2 = (double*)malloc(sizeof(double)* N);
	tempx = (double*)malloc(sizeof(double)* N);
	cL0 = (double*)malloc(sizeof(double)* (N + (N % 2) + lf));
	cH0 = (double*)malloc(sizeof(double)* (N + (N % 2) + lf));
	oup00L = (double*)malloc(sizeof(double)* (N + 2 * lf));
	oup00H = (double*)malloc(sizeof(double)* (N + 2 * lf));
	oup00 = (double*)malloc(sizeof(double)* N);
	oup01 = (double*)malloc(sizeof(double)* N);



	for (iter = J-level; iter < J; ++iter) {
		for (i = 0; i < N; ++i) {
			swtop[i] = 0.0;
		}
		if (!strcmp((ctype), "appx") && (iter == (J-level))) {
			for (i = 0; i < N; ++i) {
				appx_sig[i] = coeff[i];
				det_sig[i] = 0.0;
			}
		}
		else if (!strcmp((ctype), "det") && (iter == (J-level))) {
			for (i = 0; i < N; ++i) {
				det_sig[i] = coeff[i];
				appx_sig[i] = 0.0;
			}
		}
		else {
			for (i = 0; i < N; ++i) {
				det_sig[i] = 0.0;
			}
		}

		value = (int)pow(2.0, (double)(J - 1 - iter));

		for (count = 0; count < value; count++) {
			len = 0;
			for (index = count; index < N; index += value) {
				appx1[len] = appx_sig[index];
				det1[len] = det_sig[index];
				len++;
			}


			//SHIFT 0
			len0 = 0;

			for (index_shift = 0; index_shift < len; index_shift += 2) {
				appx2[len0] = appx1[index_shift];
				det2[len0] = det1[index_shift];
				len0++;
			}
			upsamp2(appx2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cL0);

			upsamp2(det2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cH0);

			N1 = 2 * len0 + lf;


			
			conv_direct(cL0, N1, lpr, lf, oup00L);

			
			conv_direct(cH0, N1, hpr, lf, oup00H);

			for (i = lf - 1; i < 2 * len0 + lf - 1; ++i) {
				oup00[i - lf + 1] = oup00L[i] + oup00H[i];
			}

			//SHIFT 1

			len0 = 0;

			for (index_shift = 1; index_shift < len; index_shift += 2) {
				appx2[len0] = appx1[index_shift];
				det2[len0] = det1[index_shift];
				len0++;
			}

			upsamp2(appx2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cL0);

			upsamp2(det2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cH0);

			N1 = 2 * len0 + lf;

			conv_direct(cL0, N1, lpr, lf, oup00L);

			conv_direct(cH0, N1, hpr, lf, oup00H);

			for (i = lf - 1; i < 2 * len0 + lf - 1; ++i) {
				oup01[i - lf + 1] = oup00L[i] + oup00H[i];
			}

			circshift(oup01, 2 * len0, -1);

			index2 = 0;

			for (index = count; index < N; index += value) {
				swtop[index] = (oup00[index2] + oup01[index2]) / 2.0;
				index2++;
			}

		}
		for (i = 0; i < N; ++i) {
			appx_sig[i] = swtop[i];
		}

	}



	free(appx_sig);
	free(det_sig);
	free(appx1);
	free(det1);
	free(tempx);
	free(cL0);
	free(cH0);
	free(oup00L);
	free(oup00H);
	free(oup00);
	free(oup01);
	free(appx2);
	free(det2);
}